

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O1

void __thiscall OpenMD::StaticAnalyser::writeOutput(StaticAnalyser *this)

{
  size_type *psVar1;
  ulong uVar2;
  pointer pOVar3;
  char *pcVar4;
  __uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
  _Var5;
  bool bVar6;
  char cVar7;
  char cVar8;
  int iVar9;
  ostream *poVar10;
  long lVar11;
  pointer ppAVar12;
  long *plVar13;
  undefined8 *puVar14;
  uint uVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  StaticAnalyser *pSVar19;
  pointer pOVar20;
  OutputData *data;
  Revision r;
  string message;
  string __str;
  ofstream ofs;
  Revision local_2b9;
  string local_2b8;
  ulong *local_298;
  uint local_290;
  undefined4 uStack_28c;
  ulong local_288 [2];
  ulong *local_278;
  long local_270;
  ulong local_268;
  long lStack_260;
  StaticAnalyser *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(this->outputFilename_)._M_dataplus._M_p,_S_out);
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 == '\0') {
    snprintf(painCave.errMsg,2000,"StaticAnalyser: unable to open %s\n",
             (this->outputFilename_)._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,(this->analysisType_)._M_dataplus._M_p,
                         (this->analysisType_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_2b8,&local_2b9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,local_2b8._M_dataplus._M_p,local_2b8._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_2b8,&local_2b9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,local_2b8._M_dataplus._M_p,local_2b8._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((this->paramString_)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# parameters: ",0xe)
      ;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,(this->paramString_)._M_dataplus._M_p,
                           (this->paramString_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#",1);
    pOVar20 = (this->data_).
              super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pOVar3 = (this->data_).
             super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_258 = this;
    if (pOVar20 != pOVar3) {
      do {
        if ((pOVar20->accumulator).
            super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pOVar20->accumulator).
            super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_230,(pOVar20->title)._M_dataplus._M_p,
                               (pOVar20->title)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(pOVar20->units)._M_dataplus._M_p,
                               (pOVar20->units)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
          lVar11 = (**(code **)(*(long *)(((pOVar20->accumulator).
                                           super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                         super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                         ._M_t + 0x38))();
          pcVar4 = *(char **)(lVar11 + 8);
          if (pcVar4 == "N6OpenMD7Vector3IdEE") {
LAB_00173f46:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t\t",2);
          }
          else if (*pcVar4 != '*') {
            iVar9 = strcmp(pcVar4,"N6OpenMD7Vector3IdEE");
            if (iVar9 == 0) goto LAB_00173f46;
          }
          lVar11 = (**(code **)(*(long *)(((pOVar20->accumulator).
                                           super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                         super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                         ._M_t + 0x38))();
          pcVar4 = *(char **)(lVar11 + 8);
          if (pcVar4 == "St6vectorIdSaIdEE") {
LAB_00173f94:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"(",1);
            ppAVar12 = (local_258->outputTypes_).
                       super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            if ((local_258->outputTypes_).
                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
                super__Vector_impl_data._M_finish != ppAVar12) {
              uVar18 = 0;
              uVar17 = 1;
              do {
                AtomType::getName_abi_cxx11_(&local_2b8,ppAVar12[uVar18]);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_230,local_2b8._M_dataplus._M_p,
                                     local_2b8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                  operator_delete(local_2b8._M_dataplus._M_p,
                                  local_2b8.field_2._M_allocated_capacity + 1);
                }
                ppAVar12 = (local_258->outputTypes_).
                           super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                bVar6 = uVar17 < (ulong)((long)(local_258->outputTypes_).
                                               super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)ppAVar12 >> 3);
                uVar18 = uVar17;
                uVar17 = (ulong)((int)uVar17 + 1);
              } while (bVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,")\t",2);
          }
          else if (*pcVar4 != '*') {
            iVar9 = strcmp(pcVar4,"St6vectorIdSaIdEE");
            if (iVar9 == 0) goto LAB_00173f94;
          }
        }
        pOVar20 = pOVar20 + 1;
      } while (pOVar20 != pOVar3);
    }
    std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    pSVar19 = local_258;
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 8;
    if (pSVar19->nBins_ != 0) {
      uVar18 = 0;
      do {
        pOVar3 = (pSVar19->data_).
                 super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pOVar20 = (pSVar19->data_).
                       super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                       ._M_impl.super__Vector_impl_data._M_start; pOVar20 != pOVar3;
            pOVar20 = pOVar20 + 1) {
          if ((pOVar20->accumulator).
              super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pOVar20->accumulator).
              super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::operator+(&local_250,"StaticAnalyser detected a numerical error writing: ",
                           &pOVar20->title);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_250);
            puVar16 = (ulong *)(plVar13 + 2);
            if ((ulong *)*plVar13 == puVar16) {
              local_268 = *puVar16;
              lStack_260 = plVar13[3];
              local_278 = &local_268;
            }
            else {
              local_268 = *puVar16;
              local_278 = (ulong *)*plVar13;
            }
            local_270 = plVar13[1];
            *plVar13 = (long)puVar16;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            cVar8 = '\x01';
            if (9 < uVar18) {
              uVar17 = uVar18;
              cVar7 = '\x04';
              do {
                cVar8 = cVar7;
                uVar15 = (uint)uVar17;
                if (uVar15 < 100) {
                  cVar8 = cVar8 + -2;
                  goto LAB_00174197;
                }
                if (uVar15 < 1000) {
                  cVar8 = cVar8 + -1;
                  goto LAB_00174197;
                }
                if (uVar15 < 10000) goto LAB_00174197;
                uVar17 = (uVar17 & 0xffffffff) / 10000;
                cVar7 = cVar8 + '\x04';
              } while (99999 < uVar15);
              cVar8 = cVar8 + '\x01';
            }
LAB_00174197:
            local_298 = local_288;
            std::__cxx11::string::_M_construct((ulong)&local_298,cVar8);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_298,local_290,(uint)uVar18);
            uVar17 = 0xf;
            if (local_278 != &local_268) {
              uVar17 = local_268;
            }
            uVar2 = CONCAT44(uStack_28c,local_290) + local_270;
            if (uVar17 < uVar2) {
              uVar17 = 0xf;
              if (local_298 != local_288) {
                uVar17 = local_288[0];
              }
              if (uVar17 < uVar2) goto LAB_00174201;
              puVar14 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_298,0,(char *)0x0,(ulong)local_278);
            }
            else {
LAB_00174201:
              puVar14 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_298);
            }
            local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
            psVar1 = puVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_2b8.field_2._M_allocated_capacity = *psVar1;
              local_2b8.field_2._8_8_ = puVar14[3];
            }
            else {
              local_2b8.field_2._M_allocated_capacity = *psVar1;
              local_2b8._M_dataplus._M_p = (pointer)*puVar14;
            }
            local_2b8._M_string_length = puVar14[1];
            *puVar14 = psVar1;
            puVar14[1] = 0;
            *(undefined1 *)psVar1 = 0;
            if (local_298 != local_288) {
              operator_delete(local_298,local_288[0] + 1);
            }
            if (local_278 != &local_268) {
              operator_delete(local_278,local_268 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            _Var5._M_t.
            super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
            .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl =
                 (pOVar20->accumulator).
                 super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_t.
                 super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                 ._M_t;
            (**(code **)(*(long *)_Var5._M_t.
                                  super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                  .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>.
                                  _M_head_impl + 0x48))
                      (_Var5._M_t.
                       super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                       .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl,
                       &local_230,&local_2b8,pOVar20->dataHandling);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)&local_230);
        std::ostream::put((char)&local_230);
        std::ostream::flush();
        uVar18 = uVar18 + 1;
        pSVar19 = local_258;
      } while (uVar18 < local_258->nBins_);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"#######################################################\n",
               0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# 95% confidence intervals in those quantities follow:\n",0x37
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"#######################################################\n",
               0x38);
    if (pSVar19->nBins_ != 0) {
      uVar18 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#",1);
        pOVar3 = (pSVar19->data_).
                 super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pOVar20 = (pSVar19->data_).
                       super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                       ._M_impl.super__Vector_impl_data._M_start; pOVar20 != pOVar3;
            pOVar20 = pOVar20 + 1) {
          if ((pOVar20->accumulator).
              super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pOVar20->accumulator).
              super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::operator+(&local_250,"StaticAnalyser detected a numerical error writing: ",
                           &pOVar20->title);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_250);
            puVar16 = (ulong *)(plVar13 + 2);
            if ((ulong *)*plVar13 == puVar16) {
              local_268 = *puVar16;
              lStack_260 = plVar13[3];
              local_278 = &local_268;
            }
            else {
              local_268 = *puVar16;
              local_278 = (ulong *)*plVar13;
            }
            local_270 = plVar13[1];
            *plVar13 = (long)puVar16;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            cVar8 = '\x01';
            if (9 < uVar18) {
              uVar17 = uVar18;
              cVar7 = '\x04';
              do {
                cVar8 = cVar7;
                uVar15 = (uint)uVar17;
                if (uVar15 < 100) {
                  cVar8 = cVar8 + -2;
                  goto LAB_001744ad;
                }
                if (uVar15 < 1000) {
                  cVar8 = cVar8 + -1;
                  goto LAB_001744ad;
                }
                if (uVar15 < 10000) goto LAB_001744ad;
                uVar17 = (uVar17 & 0xffffffff) / 10000;
                cVar7 = cVar8 + '\x04';
              } while (99999 < uVar15);
              cVar8 = cVar8 + '\x01';
            }
LAB_001744ad:
            local_298 = local_288;
            std::__cxx11::string::_M_construct((ulong)&local_298,cVar8);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_298,local_290,(uint)uVar18);
            uVar17 = 0xf;
            if (local_278 != &local_268) {
              uVar17 = local_268;
            }
            uVar2 = CONCAT44(uStack_28c,local_290) + local_270;
            if (uVar17 < uVar2) {
              uVar17 = 0xf;
              if (local_298 != local_288) {
                uVar17 = local_288[0];
              }
              if (uVar17 < uVar2) goto LAB_00174518;
              puVar14 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_298,0,(char *)0x0,(ulong)local_278);
            }
            else {
LAB_00174518:
              puVar14 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_298);
            }
            local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
            psVar1 = puVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_2b8.field_2._M_allocated_capacity = *psVar1;
              local_2b8.field_2._8_8_ = puVar14[3];
            }
            else {
              local_2b8.field_2._M_allocated_capacity = *psVar1;
              local_2b8._M_dataplus._M_p = (pointer)*puVar14;
            }
            local_2b8._M_string_length = puVar14[1];
            *puVar14 = psVar1;
            puVar14[1] = 0;
            *(undefined1 *)psVar1 = 0;
            if (local_298 != local_288) {
              operator_delete(local_298,local_288[0] + 1);
            }
            if (local_278 != &local_268) {
              operator_delete(local_278,local_268 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            _Var5._M_t.
            super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
            .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl =
                 (pOVar20->accumulator).
                 super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_t.
                 super___uniq_ptr_impl<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                 ._M_t;
            (**(code **)(*(long *)_Var5._M_t.
                                  super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                  .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>.
                                  _M_head_impl + 0x50))
                      (_Var5._M_t.
                       super__Tuple_impl<0UL,_OpenMD::Utils::BaseAccumulator_*,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                       .super__Head_base<0UL,_OpenMD::Utils::BaseAccumulator_*,_false>._M_head_impl,
                       &local_230,&local_2b8,0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)&local_230);
        pSVar19 = local_258;
        std::ostream::put((char)&local_230);
        std::ostream::flush();
        uVar18 = uVar18 + 1;
      } while (uVar18 < pSVar19->nBins_);
    }
    std::ostream::flush();
    std::ofstream::close();
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void StaticAnalyser::writeOutput() {
    std::ofstream ofs(outputFilename_.c_str());

    if (ofs.is_open()) {
      Revision r;
      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      // ofs << "# selection script1: \"" << selectionScript1_ ;
      // ofs << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      // write title
      ofs << "#";
      for (const auto& data : data_) {
        if (!data.accumulator.empty()) {
          ofs << "\t" << data.title << "(" << data.units << ")";

          // add some extra tabs for column alignment
          if (data.accumulator[0]->getType() ==
              std::type_index(typeid(Vector3d))) {
            ofs << "\t\t";
          }

          if (data.accumulator[0]->getType() ==
              std::type_index(typeid(std::vector<RealType>))) {
            ofs << "(";
            for (unsigned int type = 0; type < outputTypes_.size(); type++) {
              ofs << outputTypes_[type]->getName() << "\t";
            }
            ofs << ")\t";
          }
        }
      }

      ofs << std::endl;

      ofs.precision(8);

      for (unsigned int bin = 0; bin < nBins_; bin++) {
        for (const auto& data : data_) {
          if (!data.accumulator.empty()) {
            std::string message =
                "StaticAnalyser detected a numerical error writing: " +
                data.title + " for bin " + std::to_string(bin);

            data.accumulator[bin]->writeData(ofs, message, data.dataHandling);
          }
        }
        ofs << std::endl;
      }

      ofs << "#######################################################\n";
      ofs << "# 95% confidence intervals in those quantities follow:\n";
      ofs << "#######################################################\n";

      for (unsigned int bin = 0; bin < nBins_; bin++) {
        ofs << "#";

        for (const auto& data : data_) {
          if (!data.accumulator.empty()) {
            std::string message =
                "StaticAnalyser detected a numerical error writing: " +
                data.title + " std. dev. for bin " + std::to_string(bin);

            data.accumulator[bin]->writeErrorBars(ofs, message);
          }
        }
        ofs << std::endl;
      }

      ofs.flush();
      ofs.close();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StaticAnalyser: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
  }